

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelctemp.h
# Opt level: O2

int __thiscall
TPZIntelGen<pzshape::TPZShapePrism>::ClassId(TPZIntelGen<pzshape::TPZShapePrism> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_41;
  TPZPrism local_40;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZIntelGen",&local_41);
  uVar1 = Hash(&local_38);
  iVar2 = TPZInterpolatedElement::ClassId(&this->super_TPZInterpolatedElement);
  local_40.super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZShapePrism_01735ff0;
  iVar3 = pztopology::TPZPrism::ClassId(&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZIntelGen<TSHAPE>::ClassId() const{
    return Hash("TPZIntelGen") ^ TPZInterpolatedElement::ClassId() << 1 ^ TSHAPE().ClassId() << 2;
}